

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int brtrimws(bstring b)

{
  uchar uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ushort **ppuVar6;
  uchar *puVar7;
  ulong uVar8;
  
  iVar4 = -1;
  iVar5 = -1;
  if (((b != (bstring)0x0) && (puVar7 = b->data, iVar5 = iVar4, puVar7 != (uchar *)0x0)) &&
     (iVar4 = b->mlen, 0 < iVar4)) {
    uVar2 = b->slen;
    if (((int)uVar2 <= iVar4) && (uVar3 = (ulong)uVar2, -1 < (int)uVar2)) {
      do {
        uVar8 = uVar3;
        if ((long)uVar8 < 1) {
          uVar8 = 0;
          goto LAB_00111d8c;
        }
        uVar1 = puVar7[uVar8 - 1];
        if ((long)(char)uVar1 < 0) break;
        ppuVar6 = __ctype_b_loc();
        uVar3 = uVar8 - 1;
      } while ((*(byte *)((long)*ppuVar6 + (long)(char)uVar1 * 2 + 1) & 0x20) != 0);
      if ((int)uVar8 <= iVar4) {
        puVar7 = puVar7 + (uVar8 & 0xffffffff);
LAB_00111d8c:
        *puVar7 = '\0';
      }
      b->slen = (int)uVar8;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int brtrimws (bstring b) {
int i;

	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;

	for (i = b->slen - 1; i >= 0; i--) {
		if (!wspace (b->data[i])) {
			if (b->mlen > i) b->data[i+1] = (unsigned char) '\0';
			b->slen = i + 1;
			return 0;
		}
	}

	b->data[0] = (unsigned char) '\0';
	b->slen = 0;
	return 0;
}